

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O0

DenselySampledSpectrum *
pbrt::DenselySampledSpectrum::SampleFunction<RGBSpectrum_RoundTripACES_Test::TestBody()::__0>
          (anon_class_16_2_f9f080e8 func,int lambda_min,int lambda_max,Allocator alloc)

{
  Allocator alloc_00;
  int iVar1;
  reference pvVar2;
  int in_ECX;
  DenselySampledSpectrum *in_RDI;
  int in_R8D;
  int lambda;
  DenselySampledSpectrum *s;
  Float in_stack_ffffffffffffff9c;
  DenselySampledSpectrum *this;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  DenselySampledSpectrum *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  alloc_00.memoryResource._4_4_ = in_stack_ffffffffffffffc4;
  alloc_00.memoryResource._0_4_ = in_stack_ffffffffffffffc0;
  this = in_RDI;
  DenselySampledSpectrum
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,alloc_00)
  ;
  for (iVar1 = in_ECX; iVar1 <= in_R8D; iVar1 = iVar1 + 1) {
    in_stack_ffffffffffffff9c =
         RGBSpectrum_RoundTripACES_Test::TestBody::anon_class_16_2_f9f080e8::operator()
                   ((anon_class_16_2_f9f080e8 *)this,in_stack_ffffffffffffff9c);
    pvVar2 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       (&this->values,(long)(iVar1 - in_ECX));
    *pvVar2 = in_stack_ffffffffffffff9c;
  }
  return in_RDI;
}

Assistant:

static DenselySampledSpectrum SampleFunction(F func, int lambda_min = Lambda_min,
                                                 int lambda_max = Lambda_max,
                                                 Allocator alloc = {}) {
        DenselySampledSpectrum s(lambda_min, lambda_max, alloc);
        for (int lambda = lambda_min; lambda <= lambda_max; ++lambda)
            s.values[lambda - lambda_min] = func(lambda);
        return s;
    }